

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::VarScope::copyFrom(VarScope *this,VarScope *other)

{
  ValueRef *pVVar1;
  bool bVar2;
  pointer pvVar3;
  mapped_type *ppVVar4;
  long in_RSI;
  long in_RDI;
  const_iterator ie;
  const_iterator it;
  unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
  *otherSymbols;
  unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
  *thisSymbols;
  VarScope *r;
  VarScope *l;
  unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
  *in_stack_ffffffffffffffa8;
  unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
  *this_00;
  _Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true> local_40;
  _Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true> local_38;
  long local_30;
  unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
  *local_28;
  long local_20;
  long local_18;
  
  local_20 = in_RSI;
  for (local_18 = in_RDI; local_18 != 0; local_18 = *(long *)(local_18 + 0x10)) {
    local_28 = (unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
                *)(local_18 + 0x18);
    local_30 = local_20 + 0x18;
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
         ::begin(in_stack_ffffffffffffffa8);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
         ::end(in_stack_ffffffffffffffa8);
    while( true ) {
      bVar2 = std::__detail::operator!=(&local_38,&local_40);
      if (!bVar2) break;
      pvVar3 = std::__detail::
               _Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
               ::operator->((_Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                             *)0x1861a7);
      pVVar1 = pvVar3->second;
      this_00 = local_28;
      std::__detail::
      _Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>::
      operator->((_Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                  *)0x1861c4);
      ppVVar4 = std::
                unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
                ::operator[](this_00,(key_type *)in_stack_ffffffffffffffa8);
      *ppVVar4 = pVVar1;
      std::__detail::
      _Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>::
      operator++((_Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                  *)this_00);
    }
    local_20 = *(long *)(local_20 + 0x10);
  }
  return;
}

Assistant:

void VarScope::copyFrom(const VarScope *other) {
  VarScope *l = this;
  const VarScope *r = other;

  while (l) {
    assert(l->owner == r->owner && "Scope corruption");

    auto &thisSymbols = l->symbols;
    auto &otherSymbols = r->symbols;
    auto it = otherSymbols.begin();
    auto ie = otherSymbols.end();

    while (it != ie) {
      thisSymbols[it->first] = it->second;
      ++it;
    }

    l = l->parent;
    r = r->parent;
  }
}